

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O2

int av1_log_block_var(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs)

{
  int iVar1;
  aom_variance_fn_t p_Var2;
  uint uVar3;
  int iVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  uint8_t *puVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double local_40;
  uint sse;
  
  iVar4 = (x->e_mbd).mb_to_right_edge;
  iVar7 = (x->e_mbd).mb_to_bottom_edge;
  uVar5 = CONCAT71(in_register_00000011,bs) & 0xffffffff;
  uVar8 = (ulong)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar5]
          * 4 - (ulong)(iVar4 >> 0x1f & (uint)-iVar4 >> 3);
  iVar4 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar5]
          * 4 - (iVar7 >> 0x1f & (uint)-iVar7 >> 3);
  p_Var2 = cpi->ppi->fn_ptr[0].vf;
  local_40 = 0.0;
  for (iVar7 = 0; iVar7 < iVar4; iVar7 = iVar7 + 4) {
    for (lVar9 = 0; lVar9 < (long)uVar8; lVar9 = lVar9 + 4) {
      iVar1 = x->plane[0].src.stride;
      puVar6 = (uint8_t *)0x25df60;
      if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
        puVar6 = "";
      }
      uVar3 = (*p_Var2)(x->plane[0].src.buf + lVar9 + iVar7 * iVar1,iVar1,puVar6,0,&sse);
      dVar10 = log1p((double)uVar3 * 0.0625);
      local_40 = local_40 + dVar10;
    }
  }
  local_40 = local_40 /
             (double)(((int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff)
                            / 4) * iVar4) / 4);
  dVar10 = 7.0;
  if (local_40 <= 7.0) {
    dVar10 = local_40;
  }
  return (int)dVar10;
}

Assistant:

int av1_log_block_var(const AV1_COMP *cpi, const MACROBLOCK *x, BLOCK_SIZE bs) {
  DECLARE_ALIGNED(16, static const uint16_t,
                  av1_highbd_all_zeros[MAX_SB_SIZE]) = { 0 };
  DECLARE_ALIGNED(16, static const uint8_t, av1_all_zeros[MAX_SB_SIZE]) = { 0 };

  // This function returns a score for the blocks local variance as calculated
  // by: sum of the log of the (4x4 variances) of each subblock to the current
  // block (x,bs)
  // * 32 / number of pixels in the block_size.
  // This is used for segmentation because to avoid situations in which a large
  // block with a gentle gradient gets marked high variance even though each
  // subblock has a low variance.   This allows us to assign the same segment
  // number for the same sorts of area regardless of how the partitioning goes.

  const MACROBLOCKD *xd = &x->e_mbd;
  double var = 0;
  unsigned int sse;
  int i, j;

  int right_overflow =
      (xd->mb_to_right_edge < 0) ? ((-xd->mb_to_right_edge) >> 3) : 0;
  int bottom_overflow =
      (xd->mb_to_bottom_edge < 0) ? ((-xd->mb_to_bottom_edge) >> 3) : 0;

  const int bw = MI_SIZE * mi_size_wide[bs] - right_overflow;
  const int bh = MI_SIZE * mi_size_high[bs] - bottom_overflow;

  aom_variance_fn_t vf = cpi->ppi->fn_ptr[BLOCK_4X4].vf;
  for (i = 0; i < bh; i += 4) {
    for (j = 0; j < bw; j += 4) {
      if (is_cur_buf_hbd(xd)) {
        var += log1p(vf(x->plane[0].src.buf + i * x->plane[0].src.stride + j,
                        x->plane[0].src.stride,
                        CONVERT_TO_BYTEPTR(av1_highbd_all_zeros), 0, &sse) /
                     16.0);
      } else {
        var += log1p(vf(x->plane[0].src.buf + i * x->plane[0].src.stride + j,
                        x->plane[0].src.stride, av1_all_zeros, 0, &sse) /
                     16.0);
      }
    }
  }
  // Use average of 4x4 log variance. The range for 8 bit 0 - 9.704121561.
  var /= (bw / 4 * bh / 4);
  if (var > 7) var = 7;

  return (int)(var);
}